

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O0

int vorbis_synthesis_lapout(vorbis_dsp_state *v,float ***pcm)

{
  float fVar1;
  vorbis_info *pvVar2;
  long *plVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int local_7c;
  int i_1;
  float *d_1;
  float *s_1;
  float *d;
  float *s;
  float temp;
  float *p;
  int j;
  int i;
  int n1;
  int n0;
  int n;
  int hs;
  codec_setup_info *ci;
  vorbis_info *vi;
  float ***pcm_local;
  vorbis_dsp_state *v_local;
  
  pvVar2 = v->vi;
  plVar3 = (long *)pvVar2->codec_setup;
  lVar4 = plVar3[v->W];
  cVar7 = (char)(int)plVar3[0x2d2];
  iVar8 = (int)(*plVar3 >> (cVar7 + 1U & 0x3f));
  iVar9 = (int)(plVar3[1] >> (cVar7 + 1U & 0x3f));
  if (v->pcm_returned < 0) {
    v_local._4_4_ = 0;
  }
  else {
    if (v->centerW == (long)iVar9) {
      for (p._0_4_ = 0; (int)p < pvVar2->channels; p._0_4_ = (int)p + 1) {
        pfVar5 = v->pcm[(int)p];
        for (p._4_4_ = 0; p._4_4_ < iVar9; p._4_4_ = p._4_4_ + 1) {
          fVar1 = pfVar5[p._4_4_];
          pfVar5[p._4_4_] = pfVar5[p._4_4_ + iVar9];
          pfVar5[p._4_4_ + iVar9] = fVar1;
        }
      }
      v->pcm_current = v->pcm_current - iVar9;
      v->pcm_returned = v->pcm_returned - iVar9;
      v->centerW = 0;
    }
    if ((v->lW ^ v->W) == 1) {
      for (p._0_4_ = 0; (int)p < pvVar2->channels; p._0_4_ = (int)p + 1) {
        pfVar5 = v->pcm[(int)p];
        pfVar6 = v->pcm[(int)p];
        p._4_4_ = (iVar9 + iVar8) / 2;
        while (p._4_4_ = p._4_4_ + -1, -1 < p._4_4_) {
          pfVar6[(long)((iVar9 - iVar8) / 2) + (long)p._4_4_] = pfVar5[p._4_4_];
        }
      }
      v->pcm_returned = (iVar9 - iVar8) / 2 + v->pcm_returned;
      v->pcm_current = (iVar9 - iVar8) / 2 + v->pcm_current;
    }
    else if (v->lW == 0) {
      for (p._0_4_ = 0; (int)p < pvVar2->channels; p._0_4_ = (int)p + 1) {
        pfVar5 = v->pcm[(int)p];
        pfVar6 = v->pcm[(int)p];
        p._4_4_ = iVar8;
        while (p._4_4_ = p._4_4_ + -1, -1 < p._4_4_) {
          pfVar6[(long)iVar9 + ((long)p._4_4_ - (long)iVar8)] = pfVar5[p._4_4_];
        }
      }
      v->pcm_returned = (iVar9 - iVar8) + v->pcm_returned;
      v->pcm_current = (iVar9 - iVar8) + v->pcm_current;
    }
    if (pcm != (float ***)0x0) {
      for (local_7c = 0; local_7c < pvVar2->channels; local_7c = local_7c + 1) {
        v->pcmret[local_7c] = v->pcm[local_7c] + v->pcm_returned;
      }
      *pcm = v->pcmret;
    }
    v_local._4_4_ = (iVar9 + (int)(lVar4 >> (cVar7 + 1U & 0x3f))) - v->pcm_returned;
  }
  return v_local._4_4_;
}

Assistant:

int vorbis_synthesis_lapout(vorbis_dsp_state *v,float ***pcm){
  vorbis_info *vi=v->vi;
  codec_setup_info *ci=vi->codec_setup;
  int hs=ci->halfrate_flag;

  int n=ci->blocksizes[v->W]>>(hs+1);
  int n0=ci->blocksizes[0]>>(hs+1);
  int n1=ci->blocksizes[1]>>(hs+1);
  int i,j;

  if(v->pcm_returned<0)return 0;

  /* our returned data ends at pcm_returned; because the synthesis pcm
     buffer is a two-fragment ring, that means our data block may be
     fragmented by buffering, wrapping or a short block not filling
     out a buffer.  To simplify things, we unfragment if it's at all
     possibly needed. Otherwise, we'd need to call lapout more than
     once as well as hold additional dsp state.  Opt for
     simplicity. */

  /* centerW was advanced by blockin; it would be the center of the
     *next* block */
  if(v->centerW==n1){
    /* the data buffer wraps; swap the halves */
    /* slow, sure, small */
    for(j=0;j<vi->channels;j++){
      float *p=v->pcm[j];
      for(i=0;i<n1;i++){
        float temp=p[i];
        p[i]=p[i+n1];
        p[i+n1]=temp;
      }
    }

    v->pcm_current-=n1;
    v->pcm_returned-=n1;
    v->centerW=0;
  }

  /* solidify buffer into contiguous space */
  if((v->lW^v->W)==1){
    /* long/short or short/long */
    for(j=0;j<vi->channels;j++){
      float *s=v->pcm[j];
      float *d=v->pcm[j]+(n1-n0)/2;
      for(i=(n1+n0)/2-1;i>=0;--i)
        d[i]=s[i];
    }
    v->pcm_returned+=(n1-n0)/2;
    v->pcm_current+=(n1-n0)/2;
  }else{
    if(v->lW==0){
      /* short/short */
      for(j=0;j<vi->channels;j++){
        float *s=v->pcm[j];
        float *d=v->pcm[j]+n1-n0;
        for(i=n0-1;i>=0;--i)
          d[i]=s[i];
      }
      v->pcm_returned+=n1-n0;
      v->pcm_current+=n1-n0;
    }
  }

  if(pcm){
    int i;
    for(i=0;i<vi->channels;i++)
      v->pcmret[i]=v->pcm[i]+v->pcm_returned;
    *pcm=v->pcmret;
  }

  return(n1+n-v->pcm_returned);

}